

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

string * __thiscall
google::protobuf::io::SimpleDtoa_abi_cxx11_(string *__return_storage_ptr__,io *this,double value)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  UntypedFormatSpecImpl format;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  char buffer [32];
  double parsed_value;
  char local_68 [40];
  double local_40;
  Data local_38;
  code *local_30;
  double local_28;
  code *local_20;
  
  if (value < INFINITY) {
    if (-INFINITY < value) {
      if (!NAN(value)) {
        local_38 = (Data)0xf;
        local_30 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
        local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>;
        format_00.size_ = 4;
        format_00.data_ = "%.*g";
        args.len_ = 2;
        args.ptr_ = (pointer)&local_38;
        local_28 = value;
        iVar1 = absl::lts_20250127::str_format_internal::SnprintF(local_68,0x20,format_00,args);
        if (0xffffffe0 < iVar1 - 0x20U) {
          local_40 = NoLocaleStrtod(local_68,(char **)0x0);
          if ((local_40 != value) || (NAN(local_40) || NAN(value))) {
            local_38 = (Data)0x11;
            local_30 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
            local_20 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<double>;
            format_01.size_ = 4;
            format_01.data_ = "%.*g";
            args_00.len_ = 2;
            args_00.ptr_ = (pointer)&local_38;
            local_28 = value;
            iVar1 = absl::lts_20250127::str_format_internal::SnprintF
                              (local_68,0x20,format_01,args_00);
            if (iVar1 - 0x20U < 0xffffffe1) goto LAB_0023c799;
          }
          anon_unknown_0::DelocalizeRadix(local_68);
          goto LAB_0023c686;
        }
        SimpleDtoa_abi_cxx11_((io *)local_38.buf);
LAB_0023c799:
        SimpleDtoa_abi_cxx11_((io *)local_38.buf);
      }
      pcVar4 = "nan";
      goto LAB_0023c646;
    }
    pcVar4 = "-inf";
    sVar3 = 4;
  }
  else {
    pcVar4 = "inf";
LAB_0023c646:
    sVar3 = 3;
  }
  format.size_ = sVar3;
  format.data_ = pcVar4;
  absl::lts_20250127::str_format_internal::SnprintF
            (local_68,0x20,format,
             (Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl>)ZEXT816(0));
LAB_0023c686:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(local_68);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_68,local_68 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleDtoa(double value) {
  char buffer[kDoubleToBufferSize];
  return DoubleToBuffer(value, buffer);
}